

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::rangeToString<Binary_const*,Binary_const*>
          (string *__return_storage_ptr__,Detail *this,Binary *first,Binary *last)

{
  string *psVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  size_t sVar3;
  char *pcVar4;
  Detail *pDVar5;
  ReusableStringStream rss;
  long *local_70;
  long local_68;
  long local_60 [2];
  ReusableStringStream local_50;
  string *local_38;
  
  local_50.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001bf7f8;
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar3 = StringStreams::add(&pSVar2->super_StringStreams);
  local_50.m_index = sVar3;
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  local_50.m_oss =
       *(ostream **)
        &(pSVar2->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar3]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  std::__ostream_insert<char,std::char_traits<char>>(local_50.m_oss,"{ ",2);
  local_38 = __return_storage_ptr__;
  if (this != (Detail *)first) {
    pcVar4 = "false";
    if ((ulong)(byte)*this != 0) {
      pcVar4 = "true";
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar4,pcVar4 + ((ulong)(byte)*this ^ 5));
    std::__ostream_insert<char,std::char_traits<char>>(local_50.m_oss,(char *)local_70,local_68);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    pDVar5 = this + 1;
    if (pDVar5 != (Detail *)first) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(local_50.m_oss,", ",2);
        pcVar4 = "false";
        if ((ulong)(byte)*pDVar5 != 0) {
          pcVar4 = "true";
        }
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pcVar4,pcVar4 + ((ulong)(byte)*pDVar5 ^ 5));
        std::__ostream_insert<char,std::char_traits<char>>(local_50.m_oss,(char *)local_70,local_68)
        ;
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        pDVar5 = pDVar5 + 1;
      } while (pDVar5 != (Detail *)first);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_50.m_oss," }",2);
  psVar1 = local_38;
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_50);
  return psVar1;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }